

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O3

Relations dg::vr::Relations::conflicting(Type type)

{
  if (type < (UGE|ULE)) {
    return (Relations)((_Base_bitset<1UL> *)(&DAT_001020e8 + (ulong)type * 8))->_M_w;
  }
  abort();
}

Assistant:

Relations Relations::conflicting(Relations::Type type) {
    switch (type) {
    case EQ:
        return Relations().ne().slt().ult().sgt().ugt();
    case NE:
        return Relations().eq();
    case SLT:
        return Relations().eq().sgt().sge();
    case ULT:
        return Relations().eq().ugt().uge();
    case SGT:
        return Relations().eq().slt().sle();
    case UGT:
        return Relations().eq().ult().ule();
    case SLE:
        return Relations().sgt();
    case ULE:
        return Relations().ugt();
    case SGE:
        return Relations().slt();
    case UGE:
        return Relations().ult();
    case PT:
    case PF:
        return {};
    }
    assert(0 && "unreachable");
    abort();
}